

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::OnConsoleInit(CChat *this)

{
  IConsole *pIVar1;
  undefined8 in_RDI;
  
  pIVar1 = CComponent::Console((CComponent *)0x14d8fc);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say","r[text]",2,ConSay,in_RDI,"Say in chat");
  pIVar1 = CComponent::Console((CComponent *)0x14d939);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say_team","r[text]",2,ConSayTeam,in_RDI,"Say in team chat");
  pIVar1 = CComponent::Console((CComponent *)0x14d976);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say_self","r[text]",2,ConSaySelf,in_RDI,"Say message just for yourself");
  pIVar1 = CComponent::Console((CComponent *)0x14d9b3);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"whisper","i[target] r[text]",2,ConWhisper,in_RDI,"Whisper to a client in chat")
  ;
  pIVar1 = CComponent::Console((CComponent *)0x14d9f0);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"chat","s[text] ?i[whisper-target]",2,ConChat,in_RDI,
             "Enable chat with all/team/whisper mode");
  pIVar1 = CComponent::Console((CComponent *)0x14da2d);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+show_chat","",2,ConShowChat,in_RDI,"Show chat");
  pIVar1 = CComponent::Console((CComponent *)0x14da6a);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"chat_command","s[command] ?r[args]",2,ConChatCommand,in_RDI,
             "Execute a chat command with arguments");
  return;
}

Assistant:

void CChat::OnConsoleInit()
{
	Console()->Register("say", "r[text]", CFGFLAG_CLIENT, ConSay, this, "Say in chat");
	Console()->Register("say_team", "r[text]", CFGFLAG_CLIENT, ConSayTeam, this, "Say in team chat");
	Console()->Register("say_self", "r[text]", CFGFLAG_CLIENT, ConSaySelf, this, "Say message just for yourself");
	Console()->Register("whisper", "i[target] r[text]", CFGFLAG_CLIENT, ConWhisper, this, "Whisper to a client in chat");
	Console()->Register("chat", "s[text] ?i[whisper-target]", CFGFLAG_CLIENT, ConChat, this, "Enable chat with all/team/whisper mode");
	Console()->Register("+show_chat", "", CFGFLAG_CLIENT, ConShowChat, this, "Show chat");
	Console()->Register("chat_command", "s[command] ?r[args]", CFGFLAG_CLIENT, ConChatCommand, this, "Execute a chat command with arguments");
}